

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiKeyRoutingData * ImGui::GetShortcutRoutingData(ImGuiKeyChord key_chord)

{
  int *piVar1;
  ImVector<ImGuiKeyRoutingData> *pIVar2;
  int iVar3;
  int iVar4;
  bool *pbVar5;
  ImGuiContext *pIVar6;
  undefined8 in_RAX;
  ImGuiKeyRoutingData *pIVar7;
  ImGuiKeyRoutingData *pIVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  short sVar14;
  int iVar15;
  ImGuiContext *ctx;
  ImGuiKeyRoutingData *pIVar16;
  undefined2 local_33;
  undefined1 local_31;
  
  pIVar6 = GImGui;
  uVar12 = key_chord & 0xf000;
  uVar9 = key_chord & 0xffff0fffU;
  if ((((key_chord & 0xffff0fffU) == 0) && (uVar9 = uVar12, key_chord - 0x1000U < 0x8000)) &&
     (uVar13 = key_chord - 0x1000U >> 0xc, (0x8bU >> (uVar13 & 0x1f) & 1) != 0)) {
    uVar9 = *(uint *)(&DAT_0025deb0 + (ulong)uVar13 * 4);
  }
  pIVar16 = (ImGuiKeyRoutingData *)
            (&GImGui->KeysOwnerData[0x36].LockThisFrame + (long)(int)uVar9 * 2);
  pIVar8 = pIVar16;
  do {
    pbVar5 = (bool *)&pIVar8->NextEntryIndex;
    lVar11 = (long)*(short *)pbVar5;
    if (lVar11 == -1) break;
    pIVar7 = (GImGui->KeysRoutingTable).Entries.Data;
    pIVar8 = pIVar7 + lVar11;
  } while (uVar12 != pIVar7[lVar11].Mods);
  if (*(short *)pbVar5 == -1) {
    iVar3 = (GImGui->KeysRoutingTable).Entries.Size;
    iVar4 = (GImGui->KeysRoutingTable).Entries.Capacity;
    if (iVar3 == iVar4) {
      if (iVar4 == 0) {
        iVar10 = 8;
      }
      else {
        iVar10 = iVar4 / 2 + iVar4;
      }
      iVar15 = iVar3 + 1;
      if (iVar3 + 1 < iVar10) {
        iVar15 = iVar10;
      }
      if (iVar4 < iVar15) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar7 = (ImGuiKeyRoutingData *)
                 (*GImAllocatorAllocFunc)((long)iVar15 << 4,GImAllocatorUserData);
        pIVar8 = (pIVar6->KeysRoutingTable).Entries.Data;
        if (pIVar8 != (ImGuiKeyRoutingData *)0x0) {
          memcpy(pIVar7,pIVar8,(long)(pIVar6->KeysRoutingTable).Entries.Size << 4);
          pIVar8 = (pIVar6->KeysRoutingTable).Entries.Data;
          if ((pIVar8 != (ImGuiKeyRoutingData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar8,GImAllocatorUserData);
        }
        (pIVar6->KeysRoutingTable).Entries.Data = pIVar7;
        (pIVar6->KeysRoutingTable).Entries.Capacity = iVar15;
      }
    }
    pIVar8 = (pIVar6->KeysRoutingTable).Entries.Data;
    iVar4 = (pIVar6->KeysRoutingTable).Entries.Size;
    pIVar8[iVar4].NextEntryIndex = -1;
    pIVar8[iVar4].Mods = 0;
    pIVar8[iVar4].RoutingNextScore = 0xff;
    local_33 = (undefined2)((ulong)in_RAX >> 0x28);
    *(undefined2 *)&pIVar8[iVar4].field_0x5 = local_33;
    local_31 = (undefined1)((ulong)in_RAX >> 0x38);
    pIVar8[iVar4].field_0x7 = local_31;
    pIVar8[iVar4].RoutingCurr = 0xffffffff;
    pIVar8[iVar4].RoutingNext = 0xffffffff;
    pIVar2 = &(pIVar6->KeysRoutingTable).Entries;
    pIVar2->Size = pIVar2->Size + 1;
    pIVar7 = (pIVar6->KeysRoutingTable).Entries.Data;
    sVar14 = (short)iVar3;
    pIVar8 = pIVar7 + sVar14;
    pIVar7[sVar14].Mods = (ImU16)uVar12;
    pIVar7[sVar14].NextEntryIndex = pIVar16->NextEntryIndex;
    pIVar16->NextEntryIndex = sVar14;
  }
  return pIVar8;
}

Assistant:

ImGuiKeyRoutingData* ImGui::GetShortcutRoutingData(ImGuiKeyChord key_chord)
{
    // Majority of shortcuts will be Key + any number of Mods
    // We accept _Single_ mod with ImGuiKey_None.
    //  - Shortcut(ImGuiKey_S | ImGuiMod_Ctrl);                    // Legal
    //  - Shortcut(ImGuiKey_S | ImGuiMod_Ctrl | ImGuiMod_Shift);   // Legal
    //  - Shortcut(ImGuiMod_Ctrl);                                 // Legal
    //  - Shortcut(ImGuiMod_Ctrl | ImGuiMod_Shift);                // Not legal
    ImGuiContext& g = *GImGui;
    ImGuiKeyRoutingTable* rt = &g.KeysRoutingTable;
    ImGuiKeyRoutingData* routing_data;
    ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
    ImGuiKey mods = (ImGuiKey)(key_chord & ImGuiMod_Mask_);
    if (key == ImGuiKey_None)
        key = ConvertSingleModFlagToKey(mods);
    IM_ASSERT(IsNamedKey(key));

    // Get (in the majority of case, the linked list will have one element so this should be 2 reads.
    // Subsequent elements will be contiguous in memory as list is sorted/rebuilt in NewFrame).
    for (ImGuiKeyRoutingIndex idx = rt->Index[key - ImGuiKey_NamedKey_BEGIN]; idx != -1; idx = routing_data->NextEntryIndex)
    {
        routing_data = &rt->Entries[idx];
        if (routing_data->Mods == mods)
            return routing_data;
    }

    // Add to linked-list
    ImGuiKeyRoutingIndex routing_data_idx = (ImGuiKeyRoutingIndex)rt->Entries.Size;
    rt->Entries.push_back(ImGuiKeyRoutingData());
    routing_data = &rt->Entries[routing_data_idx];
    routing_data->Mods = (ImU16)mods;
    routing_data->NextEntryIndex = rt->Index[key - ImGuiKey_NamedKey_BEGIN]; // Setup linked list
    rt->Index[key - ImGuiKey_NamedKey_BEGIN] = routing_data_idx;
    return routing_data;
}